

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

string * __thiscall
pbrt::GammaColorEncoding::ToString_abi_cxx11_
          (string *__return_storage_ptr__,GammaColorEncoding *this)

{
  float *in_RCX;
  
  StringPrintf<float_const&>
            (__return_storage_ptr__,(pbrt *)"[ GammaColorEncoding gamma: %f ]",(char *)this,in_RCX);
  return __return_storage_ptr__;
}

Assistant:

std::string GammaColorEncoding::ToString() const {
    return StringPrintf("[ GammaColorEncoding gamma: %f ]", gamma);
}